

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ModSystem.cpp
# Opt level: O2

void __thiscall
DelIRCCommand::trigger
          (DelIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  undefined8 uVar5;
  ulong uVar6;
  long *plVar7;
  char *pcVar8;
  string_view section;
  string_view section_00;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  undefined8 uStack_60;
  
  if (parameters._M_len == 0) {
    pcVar8 = "Error: Too few parameters. Syntax: del <player>";
    uStack_60 = 0x2f;
  }
  else {
    lVar3 = Jupiter::IRC::Client::getChannel(source,channel._M_len,channel._M_str);
    if (lVar3 == 0) {
      return;
    }
    Jupiter::IRC::Client::Channel::getType();
    uVar6 = 0;
    do {
      RenX::getCore();
      uVar4 = RenX::Core::getServerCount();
      if (uVar4 == uVar6) {
        Jupiter::IRC::Client::sendMessage
                  (source,channel._M_len,channel._M_str,0x40,
                   "Error: Channel not attached to any connected Renegade X servers.");
        return;
      }
      uVar4 = RenX::getCore();
      uVar5 = RenX::Core::getServer(uVar4);
      cVar1 = RenX::Server::isLogChanType((int)uVar5);
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (cVar1 == '\0');
    lVar3 = RenX::Server::getPlayerByPartName(uVar5,parameters._M_len,parameters._M_str);
    if (lVar3 == 0) {
      bVar2 = RenX_ModSystemPlugin::removeModSection(&pluginInstance,parameters);
      if (!bVar2) {
        Jupiter::Plugin::getConfig();
        lVar3 = Jupiter::Config::getSections_abi_cxx11_();
        plVar7 = (long *)(lVar3 + 0x10);
        do {
          plVar7 = (long *)*plVar7;
          if (plVar7 == (long *)0x0) {
            pcVar8 = "Error: Player not found.";
            uStack_60 = 0x18;
            goto LAB_00111378;
          }
          lhs = (basic_string_view<char,_std::char_traits<char>_>)
                Jupiter::Config::get(plVar7 + 5,4,"Name",0,0);
          bVar2 = jessilib::equalsi<char,char>(lhs,parameters);
        } while (!bVar2);
        section_00._M_str = (char *)plVar7[1];
        section_00._M_len = plVar7[2];
        bVar2 = RenX_ModSystemPlugin::removeModSection(&pluginInstance,section_00);
        if (!bVar2) {
          pcVar8 = "Error: Unknown error occurred.";
          uStack_60 = 0x1e;
          goto LAB_00111378;
        }
      }
      pcVar8 = "Player has been removed from the moderator list.";
      uStack_60 = 0x30;
    }
    else {
      if (*(char *)(lVar3 + 0x100) == '\x01') {
        pcVar8 = "Error: A bot can not be a moderator.";
      }
      else {
        section._M_str = *(char **)(lVar3 + 0x68);
        section._M_len = *(size_t *)(lVar3 + 0x70);
        bVar2 = RenX_ModSystemPlugin::removeModSection(&pluginInstance,section);
        if (bVar2) {
          pcVar8 = "Player has been removed from the moderator list.";
          uStack_60 = 0x30;
          goto LAB_00111378;
        }
        pcVar8 = "Player is not in the moderator list.";
      }
      uStack_60 = 0x24;
    }
  }
LAB_00111378:
  Jupiter::IRC::Client::sendNotice(source,nick._M_len,nick._M_str,uStack_60,pcVar8);
  return;
}

Assistant:

void DelIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	std::string_view parameters_view = parameters;
	if (parameters.empty())
		source->sendNotice(nick, "Error: Too few parameters. Syntax: del <player>"sv);
	else
	{
		Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
		if (chan != nullptr)
		{
			RenX::Server *server;
			RenX::PlayerInfo *player;
			int type = chan->getType();
			bool serverMatch = false;
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
			{
				server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type))
				{
					serverMatch = true;
					player = server->getPlayerByPartName(parameters);
					if (player == nullptr)
					{
						if (pluginInstance.removeModSection(parameters))
							source->sendNotice(nick, "Player has been removed from the moderator list."sv);
						else
						{
							for (auto& section : pluginInstance.getConfig().getSections())
							{
								if (jessilib::equalsi(section.second.get("Name"sv), parameters_view)) {
									if (pluginInstance.removeModSection(section.first))
										source->sendNotice(nick, "Player has been removed from the moderator list."sv);
									else
										source->sendNotice(nick, "Error: Unknown error occurred."sv);

									return;
								}
							}

							source->sendNotice(nick, "Error: Player not found."sv);
						}
					}
					else if (player->isBot)
						source->sendNotice(nick, "Error: A bot can not be a moderator."sv);
					else if (pluginInstance.removeModSection(player->uuid))
						source->sendNotice(nick, "Player has been removed from the moderator list."sv);
					else
						source->sendNotice(nick, "Player is not in the moderator list."sv);

					break;
				}
			}
			if (serverMatch == false)
				source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		}
	}
}